

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_customData
                   (string *__return_storage_ptr__,CustomDataType *customData,string *dict_name,
                   uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  bool bVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_00;
  _Rb_tree_header *p_Var9;
  _Base_ptr p_Var10;
  undefined1 auVar11 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  stringstream ss;
  string local_248;
  pprint *local_228;
  string local_220;
  string *local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_228 = (pprint *)(ulong)indent;
  pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)indent,n);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
  paVar1 = &local_248.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (dict_name->_M_string_length == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
    n_00 = extraout_EDX;
    goto LAB_002cca01;
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  pcVar2 = (dict_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar2,pcVar2 + dict_name->_M_string_length);
  if (local_220._M_string_length == 0) {
LAB_002cc8a7:
    local_1d8 = local_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\"","");
    local_248._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_1d8,local_1d0 + (long)local_1d8);
    ::std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_220._M_dataplus._M_p);
    plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1d8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_1e8 = *plVar8;
      lStack_1e0 = plVar6[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar8;
      local_1f8 = (long *)*plVar6;
    }
    local_1f0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::string::operator=((string *)&local_220,(string *)&local_1f8);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
  }
  else {
    bVar5 = is_valid_utf8_identifier(&local_220);
    if (!bVar5) goto LAB_002cc8a7;
  }
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," = {\n",5);
  n_00 = extraout_EDX_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    n_00 = extraout_EDX_01;
  }
LAB_002cca01:
  p_Var10 = (customData->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(customData->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var9) {
    iVar3 = (int)local_228;
    do {
      print_meta(&local_248,(MetaVariable *)(p_Var10 + 2),iVar3 + 1,true,(string *)(p_Var10 + 1));
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      auVar11 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      n_00 = auVar11._8_4_;
      p_Var10 = auVar11._0_8_;
    } while ((_Rb_tree_header *)p_Var10 != p_Var9);
  }
  pprint::Indent_abi_cxx11_(&local_248,local_228,n_00);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_customData(const CustomDataType &customData,
                             const std::string &dict_name,
                             const uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);
  if (!dict_name.empty()) {
    std::string name = dict_name;

    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }

    ss << name << " = {\n";
  } else {
    ss << "{\n";
  }
  for (const auto &item : customData) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}